

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O0

void __thiscall
Rml::ElementFormControlTextArea::SetWordWrapProperties(ElementFormControlTextArea *this)

{
  Property local_118;
  Property local_c8;
  Property local_68;
  byte local_11;
  ElementFormControlTextArea *pEStack_10;
  bool word_wrap;
  ElementFormControlTextArea *this_local;
  
  pEStack_10 = this;
  local_11 = GetWordWrap(this);
  Property::Property<Rml::Style::Overflow,Rml::Style::Overflow>(&local_68,Auto - local_11);
  Element::SetProperty((Element *)this,OverflowX,&local_68);
  Property::~Property(&local_68);
  Property::Property<Rml::Style::Overflow,Rml::Style::Overflow>(&local_c8,Auto);
  Element::SetProperty((Element *)this,OverflowY,&local_c8);
  Property::~Property(&local_c8);
  Property::Property<Rml::Style::WhiteSpace,Rml::Style::WhiteSpace>
            (&local_118,(local_11 & 1) * '\x02' + Pre);
  Element::SetProperty((Element *)this,WhiteSpace,&local_118);
  Property::~Property(&local_118);
  return;
}

Assistant:

void ElementFormControlTextArea::SetWordWrapProperties()
{
	const bool word_wrap = GetWordWrap();
	SetProperty(PropertyId::OverflowX, Property(word_wrap ? Style::Overflow::Hidden : Style::Overflow::Auto));
	SetProperty(PropertyId::OverflowY, Property(Style::Overflow::Auto));
	SetProperty(PropertyId::WhiteSpace, Property(word_wrap ? Style::WhiteSpace::Prewrap : Style::WhiteSpace::Pre));
}